

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

_Bool sysbvm_weakValueDictionary_find
                (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
                sysbvm_tuple_t *outValue)

{
  _Bool _Var1;
  intptr_t iVar2;
  sysbvm_array_t *storage;
  sysbvm_dictionary_t *dictionaryObject;
  intptr_t elementIndex;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_ad04a50d gcFrame;
  sysbvm_tuple_t *outValue_local;
  sysbvm_tuple_t key_local;
  sysbvm_tuple_t dictionary_local;
  sysbvm_context_t *context_local;
  
  gcFrame.association = (sysbvm_weakValueAssociation_t *)outValue;
  _Var1 = sysbvm_tuple_isNonNullPointer(dictionary);
  if (_Var1) {
    gcFrame.key = 0;
    gcFrameRecord.roots = (sysbvm_tuple_t *)dictionary;
    gcFrame.dictionary = (sysbvm_weakValueDictionary_t *)key;
    memset(&elementIndex,0,0x20);
    gcFrameRecord.previous._0_4_ = 0;
    gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
    gcFrameRecord._12_4_ = 0;
    gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&elementIndex);
    iVar2 = sysbvm_dictionary_scanFor
                      (context,(sysbvm_dictionary_t **)&gcFrameRecord.roots,
                       (sysbvm_tuple_t *)&gcFrame);
    if (iVar2 < 0) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&elementIndex);
      context_local._7_1_ = false;
    }
    else {
      gcFrame.key = *(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x10 + iVar2 * 8);
      if ((gcFrame.key == 0) || (*(long *)(gcFrame.key + 0x18) == 0x4f)) {
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&elementIndex);
        context_local._7_1_ = false;
      }
      else {
        ((gcFrame.association)->header).field_0 =
             *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(gcFrame.key + 0x18);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&elementIndex);
        context_local._7_1_ = true;
      }
    }
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_weakValueDictionary_find(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t *outValue)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return false;

    struct {
        sysbvm_weakValueDictionary_t *dictionary;
        sysbvm_tuple_t key;
        sysbvm_weakValueAssociation_t *association;
    } gcFrame = {
        .dictionary = (sysbvm_weakValueDictionary_t*)dictionary,
        .key = key
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    intptr_t elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
    if(elementIndex < 0)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return false;
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    gcFrame.association = (sysbvm_weakValueAssociation_t*)storage->elements[elementIndex];
    if(!gcFrame.association || gcFrame.association->value == SYSBVM_TOMBSTONE_TUPLE)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return false;
    }

    *outValue = gcFrame.association->value;
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return true;
}